

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_external.cpp
# Opt level: O2

void duckdb::RowOperations::SwizzleColumns(RowLayout *layout,data_ptr_t base_row_ptr,idx_t count)

{
  PhysicalType type;
  idx_t iVar1;
  bool bVar2;
  data_ptr_t pdVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  long *plVar6;
  idx_t i;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  idx_t col_idx;
  ulong uVar10;
  data_ptr_t heap_row_ptrs [2048];
  
  iVar1 = layout->row_width;
  for (lVar9 = 0; uVar10 = count - lVar9, uVar10 != 0; lVar9 = lVar9 + uVar10) {
    if (0x7ff < uVar10) {
      uVar10 = 0x800;
    }
    pdVar3 = base_row_ptr + layout->heap_pointer_offset + lVar9 * iVar1;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      heap_row_ptrs[uVar7] = *(data_ptr_t *)pdVar3;
      pdVar3 = pdVar3 + iVar1;
    }
    for (uVar7 = 0;
        uVar7 < (ulong)(((long)(layout->types).
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               .
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(layout->types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar7 = uVar7 + 1)
    {
      pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(&layout->types,uVar7);
      type = pvVar4->physical_type_;
      bVar2 = TypeIsConstantSize(type);
      if (!bVar2) {
        pvVar5 = vector<unsigned_long,_true>::get<true>(&layout->offsets,uVar7);
        plVar6 = (long *)(base_row_ptr + *pvVar5 + lVar9 * iVar1);
        if (type == VARCHAR) {
          plVar6 = plVar6 + 1;
          for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
            if (0xc < *(uint *)(plVar6 + -1)) {
              *plVar6 = *plVar6 - (long)heap_row_ptrs[uVar8];
            }
            plVar6 = (long *)((long)plVar6 + iVar1);
          }
        }
        else {
          for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
            *plVar6 = *plVar6 - (long)heap_row_ptrs[uVar8];
            plVar6 = (long *)((long)plVar6 + iVar1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void RowOperations::SwizzleColumns(const RowLayout &layout, const data_ptr_t base_row_ptr, const idx_t count) {
	const idx_t row_width = layout.GetRowWidth();
	data_ptr_t heap_row_ptrs[STANDARD_VECTOR_SIZE];
	idx_t done = 0;
	while (done != count) {
		const idx_t next = MinValue<idx_t>(count - done, STANDARD_VECTOR_SIZE);
		const data_ptr_t row_ptr = base_row_ptr + done * row_width;
		// Load heap row pointers
		data_ptr_t heap_ptr_ptr = row_ptr + layout.GetHeapOffset();
		for (idx_t i = 0; i < next; i++) {
			heap_row_ptrs[i] = Load<data_ptr_t>(heap_ptr_ptr);
			heap_ptr_ptr += row_width;
		}
		// Loop through the blob columns
		for (idx_t col_idx = 0; col_idx < layout.ColumnCount(); col_idx++) {
			auto physical_type = layout.GetTypes()[col_idx].InternalType();
			if (TypeIsConstantSize(physical_type)) {
				continue;
			}
			data_ptr_t col_ptr = row_ptr + layout.GetOffsets()[col_idx];
			if (physical_type == PhysicalType::VARCHAR) {
				data_ptr_t string_ptr = col_ptr + string_t::HEADER_SIZE;
				for (idx_t i = 0; i < next; i++) {
					if (Load<uint32_t>(col_ptr) > string_t::INLINE_LENGTH) {
						// Overwrite the string pointer with the within-row offset (if not inlined)
						Store<idx_t>(UnsafeNumericCast<idx_t>(Load<data_ptr_t>(string_ptr) - heap_row_ptrs[i]),
						             string_ptr);
					}
					col_ptr += row_width;
					string_ptr += row_width;
				}
			} else {
				// Non-varchar blob columns
				for (idx_t i = 0; i < next; i++) {
					// Overwrite the column data pointer with the within-row offset
					Store<idx_t>(UnsafeNumericCast<idx_t>(Load<data_ptr_t>(col_ptr) - heap_row_ptrs[i]), col_ptr);
					col_ptr += row_width;
				}
			}
		}
		done += next;
	}
}